

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::~Var(Var *this)

{
  Destroy(this);
  return;
}

Assistant:

Var::~Var() {
  Destroy();
}